

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O0

void __thiscall
tchecker::details::
rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
::visit(rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
        *this,typed_par_expression_t *expr)

{
  typed_par_expression_t *expr_00;
  expression_type_t eVar1;
  typed_expression_t *ptVar2;
  allocator<char> local_39;
  string local_38;
  typed_par_expression_t *local_18;
  typed_par_expression_t *expr_local;
  rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  *this_local;
  
  local_18 = expr;
  expr_local = (typed_par_expression_t *)this;
  eVar1 = typed_expression_t::type(&expr->super_typed_expression_t);
  expr_00 = local_18;
  if (eVar1 == EXPR_TYPE_BAD) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"a parenthesized",&local_39);
    invalid_expression(this,&expr_00->super_typed_expression_t,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  ptVar2 = typed_par_expression_t::expr(local_18);
  (**(code **)(*(long *)ptVar2 + 0x30))(ptVar2,this);
  return;
}

Assistant:

virtual void visit(tchecker::typed_par_expression_t const & expr)
  {
    if (expr.type() == tchecker::EXPR_TYPE_BAD)
      invalid_expression(expr, "a parenthesized");

    // Write bytecode
    expr.expr().visit(*this);
  }